

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

OPJ_BOOL opj_tcd_decode_tile(opj_tcd_t *p_tcd,OPJ_UINT32 win_x0,OPJ_UINT32 win_y0,OPJ_UINT32 win_x1,
                            OPJ_UINT32 win_y1,OPJ_UINT32 numcomps_to_decode,
                            OPJ_UINT32 *comps_indices,OPJ_BYTE *p_src,OPJ_UINT32 p_max_length,
                            OPJ_UINT32 p_tile_no,opj_codestream_index_t *p_cstr_index,
                            opj_event_mgr_t *p_manager)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  opj_tcd_resolution_t *poVar4;
  opj_image_comp_t *poVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  OPJ_BOOL OVar8;
  uint uVar9;
  int *piVar10;
  opj_t2_t *p_t2;
  opj_mutex_t *p_manager_mutex;
  opj_image_t *poVar11;
  long lVar12;
  void *pvVar13;
  OPJ_BYTE **pData;
  OPJ_INT32 **ppOVar14;
  opj_tcd_resolution_t *poVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  char *fmt;
  OPJ_INT32 *c2;
  OPJ_FLOAT32 *c2_00;
  OPJ_UINT32 *pOVar21;
  OPJ_SIZE_T n;
  float *pfVar22;
  int *piVar23;
  opj_tcp_t *poVar24;
  int iVar25;
  float fVar26;
  OPJ_INT32 *c1;
  OPJ_FLOAT32 *c1_00;
  float fVar27;
  OPJ_INT32 *c0;
  OPJ_FLOAT32 *c0_00;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  opj_tcd_tilecomp_t *poVar33;
  opj_tccp_t *poVar34;
  float fVar35;
  long lVar36;
  opj_tcd_tile_t *poVar37;
  ulong uVar38;
  int iVar39;
  float fVar40;
  OPJ_UINT32 *pOVar41;
  opj_image_t *local_88;
  OPJ_BOOL local_74;
  ulong local_70;
  ulong local_68;
  opj_tcd_tilecomp_t *local_60;
  OPJ_UINT32 l_data_read;
  opj_tcd_tilecomp_t *local_50;
  opj_image_comp_t *local_48;
  opj_tcd_tile_t *local_40;
  ulong local_38;
  
  p_tcd->tcd_tileno = p_tile_no;
  p_tcd->tcp = p_tcd->cp->tcps + p_tile_no;
  p_tcd->win_x0 = win_x0;
  p_tcd->win_y0 = win_y0;
  p_tcd->win_x1 = win_x1;
  p_tcd->win_y1 = win_y1;
  p_tcd->whole_tile_decoding = 1;
  opj_free(p_tcd->used_component);
  p_tcd->used_component = (OPJ_BOOL *)0x0;
  if (numcomps_to_decode == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)opj_calloc(4,(ulong)p_tcd->image->numcomps);
    if (piVar10 == (int *)0x0) {
      return 0;
    }
    uVar20 = 0;
    do {
      piVar10[comps_indices[uVar20]] = 1;
      uVar20 = uVar20 + 1;
    } while (numcomps_to_decode != uVar20);
    p_tcd->used_component = piVar10;
  }
  local_88 = p_tcd->image;
  uVar20 = (ulong)local_88->numcomps;
  if (uVar20 != 0) {
    lVar32 = 4;
    lVar36 = 0;
    piVar23 = piVar10;
    do {
      local_70 = uVar20;
      if ((piVar10 == (int *)0x0) || (*piVar23 != 0)) {
        uVar28 = (ulong)*(uint *)((long)local_88->comps + lVar32 + -4);
        if (uVar28 == 0) goto LAB_0013968d;
        uVar30 = (ulong)*(uint *)((long)&local_88->comps->dx + lVar32);
        if (uVar30 == 0) goto LAB_0013968d;
        poVar33 = p_tcd->tcd_image->tiles->comps;
        uVar17 = *(int *)((long)&poVar33->numresolutions + lVar36) -
                 *(int *)((long)&poVar33->minimum_num_resolutions + lVar36);
        if (uVar17 < 0x20) {
          puVar1 = (uint *)((long)&poVar33->x0 + lVar36);
          uVar19 = (uint)(((p_tcd->win_x0 + uVar28) - 1) / uVar28);
          uVar29 = 0;
          if (*puVar1 <= uVar19) {
            uVar29 = uVar19 - *puVar1;
          }
          bVar16 = (byte)uVar17;
          if (uVar29 >> (bVar16 & 0x1f) == 0) {
            puVar1 = (uint *)((long)&poVar33->y0 + lVar36);
            uVar29 = (uint)(((p_tcd->win_y0 + uVar30) - 1) / uVar30);
            uVar17 = 0;
            if (*puVar1 <= uVar29) {
              uVar17 = uVar29 - *puVar1;
            }
            if (uVar17 >> (bVar16 & 0x1f) == 0) {
              uVar17 = *(uint *)((long)&poVar33->x1 + lVar36);
              uVar19 = (uint)(((ulong)p_tcd->win_x1 + (uVar28 - 1)) / uVar28);
              uVar29 = 0;
              if (uVar19 <= uVar17) {
                uVar29 = uVar17 - uVar19;
              }
              if (uVar29 >> (bVar16 & 0x1f) == 0) {
                uVar17 = *(uint *)((long)&poVar33->y1 + lVar36);
                uVar19 = (uint)(((p_tcd->win_y1 + uVar30) - 1) / uVar30);
                uVar29 = 0;
                if (uVar19 <= uVar17) {
                  uVar29 = uVar17 - uVar19;
                }
                if (uVar29 >> (bVar16 & 0x1f) == 0) goto LAB_00138b54;
              }
            }
          }
          p_tcd->whole_tile_decoding = 0;
          goto LAB_00138c49;
        }
      }
LAB_00138b54:
      piVar23 = piVar23 + 1;
      lVar36 = lVar36 + 0x70;
      lVar32 = lVar32 + 0x40;
    } while (uVar20 * 0x70 - lVar36 != 0);
    if (p_tcd->whole_tile_decoding == 0) {
LAB_00138c49:
      if (uVar20 != 0) {
        local_60 = p_tcd->tcd_image->tiles->comps;
        poVar5 = local_88->comps;
        uVar28 = 0;
        do {
          if ((piVar10 == (int *)0x0) || (piVar10[uVar28] != 0)) {
            uVar30 = (ulong)poVar5[uVar28].dx;
            if (uVar30 == 0) {
LAB_0013968d:
              __assert_fail("b",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                            ,0xac,"OPJ_UINT32 opj_uint_ceildiv(OPJ_UINT32, OPJ_UINT32)");
            }
            poVar33 = local_60 + uVar28;
            uVar17 = (uint)(((p_tcd->win_x0 + uVar30) - 1) / uVar30);
            if (uVar17 < (uint)poVar33->x0) {
              uVar17 = poVar33->x0;
            }
            poVar33->win_x0 = uVar17;
            uVar38 = (ulong)poVar5[uVar28].dy;
            if (uVar38 == 0) goto LAB_0013968d;
            uVar29 = (uint)(((p_tcd->win_y0 + uVar38) - 1) / uVar38);
            if (uVar29 < (uint)poVar33->y0) {
              uVar29 = poVar33->y0;
            }
            poVar33->win_y0 = uVar29;
            uVar19 = (uint)(((ulong)p_tcd->win_x1 + (uVar30 - 1)) / uVar30);
            if ((uint)poVar33->x1 < uVar19) {
              uVar19 = poVar33->x1;
            }
            poVar33->win_x1 = uVar19;
            uVar9 = (uint)(((p_tcd->win_y1 + uVar38) - 1) / uVar38);
            if ((uint)poVar33->y1 < uVar9) {
              uVar9 = poVar33->y1;
            }
            poVar33->win_y1 = uVar9;
            if ((uVar19 < uVar17) || (uVar9 < uVar29)) {
              fmt = "Invalid tilec->win_xxx values\n";
              goto LAB_001391ed;
            }
            uVar18 = poVar33->numresolutions;
            uVar30 = (ulong)uVar18;
            if (uVar30 != 0) {
              poVar4 = poVar33->resolutions;
              lVar32 = 0;
              do {
                uVar18 = uVar18 - 1;
                bVar16 = (byte)uVar18;
                uVar38 = ~(-1L << (bVar16 & 0x3f));
                *(int *)((long)&poVar4->win_x0 + lVar32) = (int)(uVar38 + uVar17 >> (bVar16 & 0x3f))
                ;
                *(int *)((long)&poVar4->win_y0 + lVar32) = (int)(uVar38 + uVar29 >> (bVar16 & 0x3f))
                ;
                *(int *)((long)&poVar4->win_x1 + lVar32) = (int)(uVar38 + uVar19 >> (bVar16 & 0x3f))
                ;
                *(int *)((long)&poVar4->win_y1 + lVar32) = (int)(uVar38 + uVar9 >> (bVar16 & 0x3f));
                lVar32 = lVar32 + 0xc0;
              } while (uVar30 * 0xc0 != lVar32);
            }
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 != uVar20);
      }
    }
    else if (uVar20 != 0) {
      lVar32 = 0;
      uVar20 = 0;
      do {
        poVar33 = p_tcd->tcd_image->tiles->comps;
        lVar36 = *(long *)((long)&poVar33->resolutions + lVar32);
        lVar31 = (ulong)(*(int *)((long)&poVar33->minimum_num_resolutions + lVar32) - 1) * 0xc0;
        if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar20] != 0)) {
          uVar28 = (long)*(int *)(lVar36 + 8 + lVar31) - (long)*(int *)(lVar36 + lVar31);
          iVar25 = *(int *)(lVar36 + 0xc + lVar31) - *(int *)(lVar36 + 4 + lVar31);
          if (((iVar25 != 0) &&
              (auVar6._8_8_ = 0, auVar6._0_8_ = (long)iVar25, auVar7._8_8_ = 0,
              auVar7._0_8_ = uVar28, SUB168(auVar6 * auVar7,8) != 0)) ||
             (uVar28 = (long)iVar25 * uVar28, 0x3fffffffffffffff < uVar28)) goto LAB_001391e6;
          *(ulong *)((long)&poVar33->data_size_needed + lVar32) = uVar28 * 4;
          OVar8 = opj_alloc_tile_component_data((opj_tcd_tilecomp_t *)((long)&poVar33->x0 + lVar32))
          ;
          if (OVar8 == 0) goto LAB_001391e6;
          local_88 = p_tcd->image;
        }
        uVar20 = uVar20 + 1;
        lVar32 = lVar32 + 0x70;
      } while (uVar20 < local_88->numcomps);
    }
  }
  l_data_read = 0;
  p_t2 = opj_t2_create(local_88,p_tcd->cp);
  if (p_t2 == (opj_t2_t *)0x0) {
    return 0;
  }
  OVar8 = opj_t2_decode_packets
                    (p_tcd,p_t2,p_tcd->tcd_tileno,p_tcd->tcd_image->tiles,p_src,&l_data_read,
                     p_max_length,p_cstr_index,p_manager);
  opj_t2_destroy(p_t2);
  if (OVar8 == 0) {
    return 0;
  }
  poVar37 = p_tcd->tcd_image->tiles;
  poVar33 = poVar37->comps;
  poVar34 = p_tcd->tcp->tccps;
  local_74 = 1;
  p_manager_mutex = opj_mutex_create();
  uVar17 = 0;
  if (p_tcd->tcp->num_layers_to_decode == p_tcd->tcp->numlayers) {
    uVar17 = poVar34->cblksty >> 4 & 1;
  }
  uVar29 = poVar37->numcomps;
  if (uVar29 != 0) {
    uVar20 = 0;
    do {
      if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar20] != 0)) {
        opj_t1_decode_cblks(p_tcd,&local_74,poVar33,poVar34,p_manager,p_manager_mutex,uVar17);
        if (local_74 == 0) break;
        uVar29 = poVar37->numcomps;
      }
      uVar20 = uVar20 + 1;
      poVar33 = poVar33 + 1;
      poVar34 = poVar34 + 1;
    } while (uVar20 < uVar29);
  }
  opj_thread_pool_wait_completion(p_tcd->thread_pool,0);
  if (p_manager_mutex != (opj_mutex_t *)0x0) {
    opj_mutex_destroy(p_manager_mutex);
  }
  if (local_74 == 0) {
    return 0;
  }
  if ((p_tcd->whole_tile_decoding == 0) && (poVar11 = p_tcd->image, poVar11->numcomps != 0)) {
    lVar32 = 0x14;
    lVar36 = 9;
    uVar20 = 0;
    do {
      poVar33 = p_tcd->tcd_image->tiles->comps;
      lVar12 = (ulong)(&poVar11->comps->dx)[lVar36] * 0xc0;
      lVar31 = *(long *)((long)poVar33 + lVar32 * 4 + -0x30);
      iVar25 = *(int *)(lVar31 + 0xb8 + lVar12);
      iVar39 = *(int *)(lVar31 + 0xb0 + lVar12);
      iVar2 = *(int *)(lVar31 + 0xb4 + lVar12);
      iVar3 = *(int *)(lVar31 + 0xbc + lVar12);
      opj_image_data_free(*(void **)(&poVar33->x0 + lVar32));
      *(undefined8 *)(&poVar33->x0 + lVar32) = 0;
      if (((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar20] != 0)) &&
         (iVar3 != iVar2 && iVar25 != iVar39)) {
        uVar28 = (ulong)(uint)(iVar3 - iVar2) * (ulong)(uint)(iVar25 - iVar39);
        if (0x3fffffffffffffff < uVar28) goto LAB_001391e6;
        pvVar13 = opj_image_data_alloc(uVar28 * 4);
        *(void **)(&poVar33->x0 + lVar32) = pvVar13;
        if (pvVar13 == (void *)0x0) goto LAB_001391e6;
      }
      uVar20 = uVar20 + 1;
      poVar11 = p_tcd->image;
      lVar32 = lVar32 + 0x1c;
      lVar36 = lVar36 + 0x10;
    } while (uVar20 < poVar11->numcomps);
  }
  poVar24 = p_tcd->tcp;
  poVar37 = p_tcd->tcd_image->tiles;
  if (poVar37->numcomps != 0) {
    poVar33 = poVar37->comps;
    pOVar21 = &p_tcd->image->comps->resno_decoded;
    pOVar41 = &poVar24->tccps->qmfbid;
    uVar20 = 0;
    do {
      if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar20] != 0)) {
        if (*pOVar41 == 1) {
          iVar25 = opj_dwt_decode(p_tcd,poVar33,*pOVar21 + 1);
        }
        else {
          iVar25 = opj_dwt_decode_real(p_tcd,poVar33,*pOVar21 + 1);
        }
        if (iVar25 == 0) {
          return 0;
        }
      }
      uVar20 = uVar20 + 1;
      poVar33 = poVar33 + 1;
      pOVar21 = pOVar21 + 0x10;
      pOVar41 = pOVar41 + 0x10e;
    } while (uVar20 < poVar37->numcomps);
    poVar24 = p_tcd->tcp;
    poVar37 = p_tcd->tcd_image->tiles;
  }
  if ((poVar24->mct == 0) || (p_tcd->used_component != (OPJ_BOOL *)0x0)) goto LAB_0013938c;
  poVar33 = poVar37->comps;
  iVar25 = p_tcd->whole_tile_decoding;
  poVar4 = poVar33->resolutions;
  if (iVar25 == 0) {
    uVar17 = poVar37->numcomps;
    if (uVar17 < 3) goto LAB_00139371;
    poVar5 = p_tcd->image->comps;
    uVar29 = poVar5->resno_decoded;
    uVar19 = poVar5[2].resno_decoded;
    if (uVar29 == uVar19 && poVar5[1].resno_decoded == uVar29) {
      n = (ulong)(poVar4[uVar29].win_y1 - poVar4[uVar29].win_y0) *
          (ulong)(poVar4[uVar29].win_x1 - poVar4[uVar29].win_x0);
      poVar4 = poVar33[1].resolutions;
      if ((ulong)(poVar4[uVar29].win_y1 - poVar4[uVar29].win_y0) *
          (ulong)(poVar4[uVar29].win_x1 - poVar4[uVar29].win_x0) - n == 0) {
        poVar4 = poVar33[2].resolutions;
        uVar20 = (ulong)(poVar4[uVar19].win_x1 - poVar4[uVar19].win_x0);
        uVar28 = (ulong)(poVar4[uVar19].win_y1 - poVar4[uVar19].win_y0);
LAB_001392cb:
        if (uVar28 * uVar20 - n == 0) {
          if (poVar24->mct == 2) {
            if (poVar24->m_mct_decoding_matrix != (OPJ_FLOAT32 *)0x0) {
              pData = (OPJ_BYTE **)opj_malloc((ulong)uVar17 << 3);
              if (pData == (OPJ_BYTE **)0x0) {
                return 0;
              }
              uVar17 = poVar37->numcomps;
              if ((ulong)uVar17 != 0) {
                ppOVar14 = &poVar33->data + (ulong)(p_tcd->whole_tile_decoding == 0) * 4;
                uVar20 = 0;
                do {
                  pData[uVar20] = (OPJ_BYTE *)*ppOVar14;
                  uVar20 = uVar20 + 1;
                  ppOVar14 = ppOVar14 + 0xe;
                } while (uVar17 != uVar20);
              }
              OVar8 = opj_mct_decode_custom
                                ((OPJ_BYTE *)poVar24->m_mct_decoding_matrix,n,pData,uVar17,
                                 p_tcd->image->comps->sgnd);
              opj_free(pData);
              if (OVar8 == 0) {
                return 0;
              }
            }
          }
          else if (poVar24->tccps->qmfbid == 1) {
            if (iVar25 == 0) {
              c0 = poVar33->data_win;
              c1 = poVar33[1].data_win;
              c2 = poVar33[2].data_win;
            }
            else {
              c0 = poVar33->data;
              c1 = poVar33[1].data;
              c2 = poVar33[2].data;
            }
            opj_mct_decode(c0,c1,c2,n);
          }
          else {
            if (iVar25 == 0) {
              c0_00 = (OPJ_FLOAT32 *)poVar33->data_win;
              c1_00 = (OPJ_FLOAT32 *)poVar33[1].data_win;
              c2_00 = (OPJ_FLOAT32 *)poVar33[2].data_win;
            }
            else {
              c0_00 = (OPJ_FLOAT32 *)poVar33->data;
              c1_00 = (OPJ_FLOAT32 *)poVar33[1].data;
              c2_00 = (OPJ_FLOAT32 *)poVar33[2].data;
            }
            opj_mct_decode_real(c0_00,c1_00,c2_00,n);
          }
          goto LAB_0013938c;
        }
      }
    }
  }
  else {
    uVar17 = poVar37->numcomps;
    if (uVar17 < 3) {
LAB_00139371:
      opj_event_msg(p_manager,1,
                    "Number of components (%d) is inconsistent with a MCT. Skip the MCT step.\n");
LAB_0013938c:
      local_40 = p_tcd->tcd_image->tiles;
      if (local_40->numcomps != 0) {
        local_48 = p_tcd->image->comps;
        poVar34 = p_tcd->tcp->tccps;
        local_50 = local_40->comps;
        local_68 = 0;
        do {
          if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[local_68] != 0))
          {
            poVar4 = local_50->resolutions;
            poVar15 = poVar4 + local_48->resno_decoded;
            if (p_tcd->whole_tile_decoding == 0) {
              iVar25 = poVar15->win_x1 - poVar15->win_x0;
              uVar29 = poVar15->win_y1 - poVar15->win_y0;
              pfVar22 = (float *)local_50->data_win;
              uVar17 = 0;
            }
            else {
              iVar25 = poVar15->x1 - poVar15->x0;
              uVar17 = local_50->minimum_num_resolutions - 1;
              uVar19 = poVar4[uVar17].x1 - poVar4[uVar17].x0;
              uVar17 = uVar19 - iVar25;
              pfVar22 = (float *)local_50->data;
              uVar29 = poVar15->y1 - poVar15->y0;
              if (uVar29 == 0) {
                uVar29 = 0;
              }
              else if (local_50->data_size / (ulong)uVar29 < (ulong)uVar19) {
                __assert_fail("l_height == 0 || l_width + l_stride <= l_tile_comp->data_size / l_height"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/tcd.c"
                              ,0x8a0,"OPJ_BOOL opj_tcd_dc_level_shift_decode(opj_tcd_t *)");
              }
            }
            bVar16 = (byte)local_48->prec;
            if (local_48->sgnd == 0) {
              fVar40 = (float)~(-1 << (bVar16 & 0x1f));
              fVar35 = 0.0;
            }
            else {
              iVar39 = 1 << (bVar16 - 1 & 0x1f);
              fVar35 = (float)-iVar39;
              fVar40 = (float)(iVar39 + -1);
            }
            if (poVar34->qmfbid == 1) {
              if (uVar29 != 0) {
                uVar19 = 0;
                iVar39 = iVar25;
                do {
                  for (; iVar39 != 0; iVar39 = iVar39 + -1) {
                    fVar26 = (float)(poVar34->m_dc_level_shift + (int)*pfVar22);
                    fVar27 = fVar40;
                    if ((int)fVar26 < (int)fVar40) {
                      fVar27 = fVar26;
                    }
                    if ((int)fVar26 < (int)fVar35) {
                      fVar27 = fVar35;
                    }
                    *pfVar22 = fVar27;
                    pfVar22 = pfVar22 + 1;
                  }
                  pfVar22 = pfVar22 + uVar17;
                  uVar19 = uVar19 + 1;
                  iVar39 = iVar25;
                } while (uVar19 != uVar29);
              }
            }
            else if (uVar29 != 0) {
              local_38 = (ulong)uVar17;
              uVar17 = 0;
              local_70 = CONCAT44(local_70._4_4_,iVar25);
              do {
                local_60 = (opj_tcd_tilecomp_t *)CONCAT44(local_60._4_4_,uVar17);
                for (; iVar25 != 0; iVar25 = iVar25 + -1) {
                  fVar27 = *pfVar22;
                  fVar26 = fVar40;
                  if ((fVar27 <= 2.1474836e+09) && (fVar26 = fVar35, -2.1474836e+09 <= fVar27)) {
                    lVar36 = lrintf(fVar27);
                    lVar36 = poVar34->m_dc_level_shift + lVar36;
                    lVar32 = lVar36;
                    if ((int)fVar40 <= lVar36) {
                      lVar32 = (long)(int)fVar40;
                    }
                    fVar26 = (float)lVar32;
                    if (lVar36 < (int)fVar35) {
                      fVar26 = fVar35;
                    }
                  }
                  *pfVar22 = fVar26;
                  pfVar22 = pfVar22 + 1;
                }
                pfVar22 = pfVar22 + local_38;
                uVar17 = (int)local_60 + 1;
                iVar25 = (int)local_70;
              } while (uVar17 != uVar29);
            }
          }
          local_68 = local_68 + 1;
          local_48 = local_48 + 1;
          poVar34 = poVar34 + 1;
          local_50 = local_50 + 1;
        } while (local_68 < local_40->numcomps);
      }
      return 1;
    }
    uVar29 = poVar33->minimum_num_resolutions;
    if ((uVar29 == poVar33[1].minimum_num_resolutions) &&
       (uVar29 == poVar33[2].minimum_num_resolutions)) {
      poVar5 = p_tcd->image->comps;
      if ((poVar5->resno_decoded == poVar5[1].resno_decoded) &&
         (poVar5->resno_decoded == poVar5[2].resno_decoded)) {
        n = ((long)poVar4[(ulong)uVar29 - 1].y1 - (long)poVar4[(ulong)uVar29 - 1].y0) *
            ((long)poVar4[(ulong)uVar29 - 1].x1 - (long)poVar4[(ulong)uVar29 - 1].x0);
        poVar4 = poVar33[1].resolutions;
        if (((long)poVar4[(ulong)uVar29 - 1].y1 - (long)poVar4[(ulong)uVar29 - 1].y0) *
            ((long)poVar4[(ulong)uVar29 - 1].x1 - (long)poVar4[(ulong)uVar29 - 1].x0) - n == 0) {
          poVar4 = poVar33[2].resolutions;
          uVar20 = (long)poVar4[(ulong)uVar29 - 1].x1 - (long)poVar4[(ulong)uVar29 - 1].x0;
          uVar28 = (long)poVar4[(ulong)uVar29 - 1].y1 - (long)poVar4[(ulong)uVar29 - 1].y0;
          goto LAB_001392cb;
        }
      }
    }
  }
  fmt = "Tiles don\'t all have the same dimension. Skip the MCT step.\n";
LAB_001391ed:
  opj_event_msg(p_manager,1,fmt);
  return 0;
LAB_001391e6:
  fmt = "Size of tile data exceeds system limits\n";
  goto LAB_001391ed;
}

Assistant:

OPJ_BOOL opj_tcd_decode_tile(opj_tcd_t *p_tcd,
                             OPJ_UINT32 win_x0,
                             OPJ_UINT32 win_y0,
                             OPJ_UINT32 win_x1,
                             OPJ_UINT32 win_y1,
                             OPJ_UINT32 numcomps_to_decode,
                             const OPJ_UINT32 *comps_indices,
                             OPJ_BYTE *p_src,
                             OPJ_UINT32 p_max_length,
                             OPJ_UINT32 p_tile_no,
                             opj_codestream_index_t *p_cstr_index,
                             opj_event_mgr_t *p_manager
                            )
{
    OPJ_UINT32 l_data_read;
    OPJ_UINT32 compno;

    p_tcd->tcd_tileno = p_tile_no;
    p_tcd->tcp = &(p_tcd->cp->tcps[p_tile_no]);
    p_tcd->win_x0 = win_x0;
    p_tcd->win_y0 = win_y0;
    p_tcd->win_x1 = win_x1;
    p_tcd->win_y1 = win_y1;
    p_tcd->whole_tile_decoding = OPJ_TRUE;

    opj_free(p_tcd->used_component);
    p_tcd->used_component = NULL;

    if (numcomps_to_decode) {
        OPJ_BOOL* used_component = (OPJ_BOOL*) opj_calloc(sizeof(OPJ_BOOL),
                                   p_tcd->image->numcomps);
        if (used_component == NULL) {
            return OPJ_FALSE;
        }
        for (compno = 0; compno < numcomps_to_decode; compno++) {
            used_component[ comps_indices[compno] ] = OPJ_TRUE;
        }

        p_tcd->used_component = used_component;
    }

    for (compno = 0; compno < p_tcd->image->numcomps; compno++) {
        if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
            continue;
        }

        if (!opj_tcd_is_whole_tilecomp_decoding(p_tcd, compno)) {
            p_tcd->whole_tile_decoding = OPJ_FALSE;
            break;
        }
    }

    if (p_tcd->whole_tile_decoding) {
        for (compno = 0; compno < p_tcd->image->numcomps; compno++) {
            opj_tcd_tilecomp_t* tilec = &(p_tcd->tcd_image->tiles->comps[compno]);
            opj_tcd_resolution_t *l_res = &
                                          (tilec->resolutions[tilec->minimum_num_resolutions - 1]);
            OPJ_SIZE_T l_data_size;

            /* compute l_data_size with overflow check */
            OPJ_SIZE_T res_w = (OPJ_SIZE_T)(l_res->x1 - l_res->x0);
            OPJ_SIZE_T res_h = (OPJ_SIZE_T)(l_res->y1 - l_res->y0);

            if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
                continue;
            }

            /* issue 733, l_data_size == 0U, probably something wrong should be checked before getting here */
            if (res_h > 0 && res_w > SIZE_MAX / res_h) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Size of tile data exceeds system limits\n");
                return OPJ_FALSE;
            }
            l_data_size = res_w * res_h;

            if (SIZE_MAX / sizeof(OPJ_UINT32) < l_data_size) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Size of tile data exceeds system limits\n");
                return OPJ_FALSE;
            }
            l_data_size *= sizeof(OPJ_UINT32);

            tilec->data_size_needed = l_data_size;

            if (!opj_alloc_tile_component_data(tilec)) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Size of tile data exceeds system limits\n");
                return OPJ_FALSE;
            }
        }
    } else {
        /* Compute restricted tile-component and tile-resolution coordinates */
        /* of the window of interest, but defer the memory allocation until */
        /* we know the resno_decoded */
        for (compno = 0; compno < p_tcd->image->numcomps; compno++) {
            OPJ_UINT32 resno;
            opj_tcd_tilecomp_t* tilec = &(p_tcd->tcd_image->tiles->comps[compno]);
            opj_image_comp_t* image_comp = &(p_tcd->image->comps[compno]);

            if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
                continue;
            }

            /* Compute the intersection of the area of interest, expressed in tile coordinates */
            /* with the tile coordinates */
            tilec->win_x0 = opj_uint_max(
                                (OPJ_UINT32)tilec->x0,
                                opj_uint_ceildiv(p_tcd->win_x0, image_comp->dx));
            tilec->win_y0 = opj_uint_max(
                                (OPJ_UINT32)tilec->y0,
                                opj_uint_ceildiv(p_tcd->win_y0, image_comp->dy));
            tilec->win_x1 = opj_uint_min(
                                (OPJ_UINT32)tilec->x1,
                                opj_uint_ceildiv(p_tcd->win_x1, image_comp->dx));
            tilec->win_y1 = opj_uint_min(
                                (OPJ_UINT32)tilec->y1,
                                opj_uint_ceildiv(p_tcd->win_y1, image_comp->dy));
            if (tilec->win_x1 < tilec->win_x0 ||
                    tilec->win_y1 < tilec->win_y0) {
                /* We should not normally go there. The circumstance is when */
                /* the tile coordinates do not intersect the area of interest */
                /* Upper level logic should not even try to decode that tile */
                opj_event_msg(p_manager, EVT_ERROR,
                              "Invalid tilec->win_xxx values\n");
                return OPJ_FALSE;
            }

            for (resno = 0; resno < tilec->numresolutions; ++resno) {
                opj_tcd_resolution_t *res = tilec->resolutions + resno;
                res->win_x0 = opj_uint_ceildivpow2(tilec->win_x0,
                                                   tilec->numresolutions - 1 - resno);
                res->win_y0 = opj_uint_ceildivpow2(tilec->win_y0,
                                                   tilec->numresolutions - 1 - resno);
                res->win_x1 = opj_uint_ceildivpow2(tilec->win_x1,
                                                   tilec->numresolutions - 1 - resno);
                res->win_y1 = opj_uint_ceildivpow2(tilec->win_y1,
                                                   tilec->numresolutions - 1 - resno);
            }
        }
    }

#ifdef TODO_MSD /* FIXME */
    /* INDEX >>  */
    if (p_cstr_info) {
        OPJ_UINT32 resno, compno, numprec = 0;
        for (compno = 0; compno < (OPJ_UINT32) p_cstr_info->numcomps; compno++) {
            opj_tcp_t *tcp = &p_tcd->cp->tcps[0];
            opj_tccp_t *tccp = &tcp->tccps[compno];
            opj_tcd_tilecomp_t *tilec_idx = &p_tcd->tcd_image->tiles->comps[compno];
            for (resno = 0; resno < tilec_idx->numresolutions; resno++) {
                opj_tcd_resolution_t *res_idx = &tilec_idx->resolutions[resno];
                p_cstr_info->tile[p_tile_no].pw[resno] = res_idx->pw;
                p_cstr_info->tile[p_tile_no].ph[resno] = res_idx->ph;
                numprec += res_idx->pw * res_idx->ph;
                p_cstr_info->tile[p_tile_no].pdx[resno] = tccp->prcw[resno];
                p_cstr_info->tile[p_tile_no].pdy[resno] = tccp->prch[resno];
            }
        }
        p_cstr_info->tile[p_tile_no].packet = (opj_packet_info_t *) opj_malloc(
                p_cstr_info->numlayers * numprec * sizeof(opj_packet_info_t));
        p_cstr_info->packno = 0;
    }
    /* << INDEX */
#endif

    /*--------------TIER2------------------*/
    /* FIXME _ProfStart(PGROUP_T2); */
    l_data_read = 0;
    if (! opj_tcd_t2_decode(p_tcd, p_src, &l_data_read, p_max_length, p_cstr_index,
                            p_manager)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_T2); */

    /*------------------TIER1-----------------*/

    /* FIXME _ProfStart(PGROUP_T1); */
    if (! opj_tcd_t1_decode(p_tcd, p_manager)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_T1); */


    /* For subtile decoding, now we know the resno_decoded, we can allocate */
    /* the tile data buffer */
    if (!p_tcd->whole_tile_decoding) {
        for (compno = 0; compno < p_tcd->image->numcomps; compno++) {
            opj_tcd_tilecomp_t* tilec = &(p_tcd->tcd_image->tiles->comps[compno]);
            opj_image_comp_t* image_comp = &(p_tcd->image->comps[compno]);
            opj_tcd_resolution_t *res = tilec->resolutions + image_comp->resno_decoded;
            OPJ_SIZE_T w = res->win_x1 - res->win_x0;
            OPJ_SIZE_T h = res->win_y1 - res->win_y0;
            OPJ_SIZE_T l_data_size;

            opj_image_data_free(tilec->data_win);
            tilec->data_win = NULL;

            if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
                continue;
            }

            if (w > 0 && h > 0) {
                if (w > SIZE_MAX / h) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Size of tile data exceeds system limits\n");
                    return OPJ_FALSE;
                }
                l_data_size = w * h;
                if (l_data_size > SIZE_MAX / sizeof(OPJ_INT32)) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Size of tile data exceeds system limits\n");
                    return OPJ_FALSE;
                }
                l_data_size *= sizeof(OPJ_INT32);

                tilec->data_win = (OPJ_INT32*) opj_image_data_alloc(l_data_size);
                if (tilec->data_win == NULL) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Size of tile data exceeds system limits\n");
                    return OPJ_FALSE;
                }
            }
        }
    }

    /*----------------DWT---------------------*/

    /* FIXME _ProfStart(PGROUP_DWT); */
    if
    (! opj_tcd_dwt_decode(p_tcd)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_DWT); */

    /*----------------MCT-------------------*/
    /* FIXME _ProfStart(PGROUP_MCT); */
    if
    (! opj_tcd_mct_decode(p_tcd, p_manager)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_MCT); */

    /* FIXME _ProfStart(PGROUP_DC_SHIFT); */
    if
    (! opj_tcd_dc_level_shift_decode(p_tcd)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_DC_SHIFT); */


    /*---------------TILE-------------------*/
    return OPJ_TRUE;
}